

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::JoinHashTable::Hash
          (JoinHashTable *this,DataChunk *keys,SelectionVector *sel,idx_t count,Vector *hashes)

{
  idx_t iVar1;
  reference pvVar2;
  size_type sVar3;
  
  iVar1 = keys->count;
  pvVar2 = vector<duckdb::Vector,_true>::operator[](&keys->data,0);
  if (iVar1 == count) {
    VectorOperations::Hash(pvVar2,hashes,keys->count);
    if (1 < (ulong)(((long)(this->equality_types).
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->equality_types).
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      sVar3 = 1;
      do {
        pvVar2 = vector<duckdb::Vector,_true>::operator[](&keys->data,sVar3);
        VectorOperations::CombineHash(hashes,pvVar2,keys->count);
        sVar3 = sVar3 + 1;
      } while (sVar3 < (ulong)(((long)(this->equality_types).
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      .
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->equality_types).
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      .
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
  }
  else {
    VectorOperations::Hash(pvVar2,hashes,sel,count);
    if (1 < (ulong)(((long)(this->equality_types).
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->equality_types).
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      sVar3 = 1;
      do {
        pvVar2 = vector<duckdb::Vector,_true>::operator[](&keys->data,sVar3);
        VectorOperations::CombineHash(hashes,pvVar2,sel,count);
        sVar3 = sVar3 + 1;
      } while (sVar3 < (ulong)(((long)(this->equality_types).
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      .
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->equality_types).
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      .
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
  }
  return;
}

Assistant:

void JoinHashTable::Hash(DataChunk &keys, const SelectionVector &sel, idx_t count, Vector &hashes) {
	if (count == keys.size()) {
		// no null values are filtered: use regular hash functions
		VectorOperations::Hash(keys.data[0], hashes, keys.size());
		for (idx_t i = 1; i < equality_types.size(); i++) {
			VectorOperations::CombineHash(hashes, keys.data[i], keys.size());
		}
	} else {
		// null values were filtered: use selection vector
		VectorOperations::Hash(keys.data[0], hashes, sel, count);
		for (idx_t i = 1; i < equality_types.size(); i++) {
			VectorOperations::CombineHash(hashes, keys.data[i], sel, count);
		}
	}
}